

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void runhcmp(runcxdef *ctx,uint siz,uint below,runsdef *val1,runsdef *val2,runsdef *val3)

{
  ushort uVar1;
  runsdef *prVar2;
  ushort *puVar3;
  runsdef *prVar4;
  bool bVar5;
  ushort *puVar6;
  runsdef *prVar7;
  ushort *__dest;
  ushort *__src;
  
  prVar2 = ctx->runcxstk;
  __dest = (ushort *)ctx->runcxheap;
  puVar3 = (ushort *)ctx->runcxhp;
  prVar4 = ctx->runcxsp;
  puVar6 = __dest;
LAB_00132bb3:
  __src = puVar6;
  if (puVar3 <= __src) {
    ctx->runcxhp = (uchar *)__dest;
    if ((uint)(*(int *)&ctx->runcxhtop - (int)__dest) < siz) {
      ctx->runcxerr->errcxptr->erraac = 0;
      runsign(ctx,0x3ea);
    }
    return;
  }
  uVar1 = *__src;
  bVar5 = false;
  for (prVar7 = prVar2; prVar7 < prVar4 + below; prVar7 = prVar7 + 1) {
    if (((prVar7->runstyp | 4) == 7) && ((ushort *)(prVar7->runsv).runsvnum == __src)) {
      (prVar7->runsv).runsvstr = (uchar *)__dest;
      bVar5 = true;
    }
  }
  if ((val1 != (runsdef *)0x0) && ((ushort *)(val1->runsv).runsvnum == __src)) {
    (val1->runsv).runsvstr = (uchar *)__dest;
    bVar5 = true;
  }
  if ((val2 != (runsdef *)0x0) && ((ushort *)(val2->runsv).runsvnum == __src)) {
    (val2->runsv).runsvstr = (uchar *)__dest;
    bVar5 = true;
  }
  puVar6 = (ushort *)((ulong)uVar1 + (long)__src);
  if ((val3 == (runsdef *)0x0) || ((ushort *)(val3->runsv).runsvnum != __src)) goto LAB_00132c1a;
  (val3->runsv).runsvstr = (uchar *)__dest;
  goto LAB_00132c24;
LAB_00132c1a:
  if (bVar5) {
LAB_00132c24:
    if (__src != __dest) {
      memmove(__dest,__src,(ulong)*__src);
    }
    __dest = (ushort *)((long)__dest + (ulong)*__dest);
  }
  goto LAB_00132bb3;
}

Assistant:

void runhcmp(runcxdef *ctx, uint siz, uint below,
             runsdef *val1, runsdef *val2, runsdef *val3)
{
    uchar   *hp   = ctx->runcxheap;
    uchar   *htop = ctx->runcxhp;
    runsdef *stop = ctx->runcxsp + below;
    runsdef *stk  = ctx->runcxstk;
    runsdef *sp;
    uchar   *dst  = hp;
    uchar   *hnxt;
    int      ref;
    
    /* go through heap, finding references on stack */
    for ( ; hp < htop ; hp = hnxt)
    {
        hnxt = hp + osrp2(hp);                /* remember next heap element */

        for (ref = FALSE, sp = stk ; sp < stop ; ++sp)
        {
            switch(sp->runstyp)
            {
            case DAT_SSTRING:
            case DAT_LIST:
                if (sp->runsv.runsvstr == hp)    /* reference to this item? */
                {
                    ref = TRUE;             /* this heap item is referenced */
                    sp->runsv.runsvstr = dst;      /* reflect imminent move */
                }
                break;
                
            default:                /* other types do not refer to the heap */
                break;
            }
        }

        /* check the explicitly referenced value pointers as well */
#define CHECK_VAL(val) \
        if (val && val->runsv.runsvstr == hp) \
            ref = TRUE, val->runsv.runsvstr = dst;
        CHECK_VAL(val1);
        CHECK_VAL(val2);
        CHECK_VAL(val3);
#undef CHECK_VAL

        /* if referenced, copy it to dst and advance dst */
        if (ref)
        {
            if (hp != dst) memmove(dst, hp, (size_t)osrp2(hp));
            dst += osrp2(dst);
        }
    }

    /* set heap pointer based on shuffled heap */
    ctx->runcxhp = dst;
    
    /* check for space requested, and signal error if not available */
    if ((uint)(ctx->runcxhtop - ctx->runcxhp) < siz)
        runsig(ctx, ERR_HPOVF);
}